

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void remove_property_insn(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  MIR_context_t ctx_00;
  MIR_insn_t_conflict insn_00;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t new_insn;
  MIR_context_t ctx;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  if ((((int)*(undefined8 *)&insn->field_0x18 != 0xb6) &&
      ((int)*(undefined8 *)&insn->field_0x18 != 0xb7)) &&
     ((int)*(undefined8 *)&insn->field_0x18 != 0xb8)) {
    __assert_fail("insn->code == MIR_PRSET || insn->code == MIR_PRBEQ || insn->code == MIR_PRBNE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x22ee,"void remove_property_insn(gen_ctx_t, MIR_insn_t)");
  }
  if ((((int)*(undefined8 *)&insn->field_0x18 == 0xb6) ||
      (((int)*(undefined8 *)&insn->field_0x18 == 0xb7 &&
       (((undefined1  [32])((undefined1  [32])insn[1].ops[0].u & (undefined1  [32])0xff) !=
         (undefined1  [32])0x3 || (*(long *)((long)&insn[1].ops[0].u + 0x10) != 0)))))) ||
     (((int)*(undefined8 *)&insn->field_0x18 == 0xb8 &&
      (((undefined1  [32])((undefined1  [32])insn[1].ops[0].u & (undefined1  [32])0xff) !=
        (undefined1  [32])0x3 || (*(long *)((long)&insn[1].ops[0].u + 0x10) == 0)))))) {
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"      removing ");
      print_insn(gen_ctx,insn,1);
    }
    gen_delete_insn(gen_ctx,insn);
  }
  else {
    ctx_00 = gen_ctx->ctx;
    insn_00 = MIR_new_insn(ctx_00,MIR_JMP);
    MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,insn,insn_00);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"      changing ");
      print_insn(gen_ctx,insn,0);
    }
    insn_00->data = insn->data;
    if (gen_ctx->optimize_level != 0) {
      *(MIR_insn_t_conflict *)insn->data = insn_00;
    }
    MIR_remove_insn(ctx_00,gen_ctx->curr_func_item,insn);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file," to ");
      print_insn(gen_ctx,insn_00,1);
    }
  }
  return;
}

Assistant:

static void remove_property_insn (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  gen_assert (insn->code == MIR_PRSET || insn->code == MIR_PRBEQ || insn->code == MIR_PRBNE);
  if (insn->code == MIR_PRSET
      || (insn->code == MIR_PRBEQ && (insn->ops[2].mode != MIR_OP_INT || insn->ops[2].u.i != 0))
      || (insn->code == MIR_PRBNE && (insn->ops[2].mode != MIR_OP_INT || insn->ops[2].u.i == 0))) {
    DEBUG (2, {
      fprintf (debug_file, "      removing ");
      print_insn (gen_ctx, insn, TRUE);
    });
    gen_delete_insn (gen_ctx, insn);
  } else { /* make unconditional jump */
    MIR_context_t ctx = gen_ctx->ctx;
    MIR_insn_t new_insn = MIR_new_insn (ctx, MIR_JMP, insn->ops[0]);
    MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
    DEBUG (2, {
      fprintf (debug_file, "      changing ");
      print_insn (gen_ctx, insn, FALSE);
    });
    new_insn->data = insn->data;
    if (optimize_level > 0) {
      bb_insn_t bb_insn = insn->data;
      bb_insn->insn = new_insn;
    }
    MIR_remove_insn (ctx, curr_func_item, insn);
    DEBUG (2, {
      fprintf (debug_file, " to ");
      print_insn (gen_ctx, new_insn, TRUE);
    });
  }
}